

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_fast_extDict
              (char *source,char *dest,int originalSize,void *dictStart,size_t dictSize)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  byte bVar3;
  BYTE BVar4;
  ushort uVar5;
  undefined8 uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  BYTE *s;
  BYTE *pBVar10;
  BYTE *pBVar11;
  BYTE *d_2;
  BYTE *pBVar12;
  ulong uVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  long lVar16;
  ushort *puVar17;
  ushort *puVar18;
  BYTE *d;
  BYTE *pBVar19;
  ulong uVar20;
  ulong uVar21;
  int local_50;
  BYTE *local_38;
  
  if (source == (char *)0x0) {
    return -1;
  }
  lVar16 = dictSize + (long)dictStart;
  if (dictStart == (void *)0x0) {
    lVar16 = 0;
  }
  if (originalSize == 0) {
    return -(uint)(*source != '\0') | 1;
  }
  pBVar1 = (BYTE *)(dest + originalSize);
  local_50 = (int)source;
  pBVar19 = (BYTE *)dest;
  if (originalSize < 0x40) goto LAB_0011901f;
LAB_00118bb4:
  bVar3 = (byte)*(ushort *)source;
  uVar9 = (uint)bVar3;
  uVar8 = (uint)(bVar3 >> 4);
  if (uVar8 == 0xf) {
    uVar8 = 0;
    puVar18 = (ushort *)((long)source + 0x10);
    do {
      puVar17 = puVar18;
      uVar8 = uVar8 + *(byte *)((long)puVar17 + -0xf);
      puVar18 = (ushort *)((long)puVar17 + 1);
    } while (*(byte *)((long)puVar17 + -0xf) == 0xff);
    uVar13 = (ulong)uVar8;
    pBVar12 = pBVar19 + uVar13 + 0xf;
    if (dest + (long)originalSize + -8 < pBVar12) {
      uVar13 = uVar13 + 0xf;
      source = (char *)(puVar17 + -7);
      goto LAB_00118ecd;
    }
    puVar18 = puVar17 + -7;
    do {
      *(undefined8 *)pBVar19 = *(undefined8 *)puVar18;
      pBVar19 = pBVar19 + 8;
      puVar18 = puVar18 + 4;
    } while (pBVar19 < pBVar12);
    puVar18 = (ushort *)((long)puVar17 + 1 + uVar13);
  }
  else {
    *(undefined8 *)pBVar19 = *(undefined8 *)((long)source + 1);
    if (0x8f < bVar3) {
      *(undefined8 *)(pBVar19 + 8) = *(undefined8 *)((long)source + 9);
    }
    pBVar12 = pBVar19 + uVar8;
    puVar18 = (ushort *)((byte *)((long)source + 1) + uVar8);
  }
  uVar5 = *puVar18;
  uVar21 = (ulong)uVar5;
  source = (char *)(puVar18 + 1);
  pBVar14 = pBVar12 + -uVar21;
  uVar13 = (ulong)(bVar3 & 0xf);
  if (uVar13 == 0xf) {
    uVar9 = 0;
    do {
      uVar7 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar9 = uVar9 + (byte)uVar7;
    } while ((byte)uVar7 == 0xff);
    uVar20 = (ulong)uVar9 + 0x13;
    if (pBVar1 + -0x40 <= pBVar12 + (ulong)uVar9 + 0x13) goto LAB_00118f2b;
  }
  else {
    uVar20 = uVar13 + 4;
    if (pBVar1 + -0x40 <= pBVar12 + uVar13 + 4) goto LAB_00118f2b;
    if ((dest <= pBVar14) && (7 < uVar5)) {
      *(undefined8 *)pBVar12 = *(undefined8 *)pBVar14;
      *(undefined8 *)(pBVar12 + 8) = *(undefined8 *)(pBVar14 + 8);
      *(undefined2 *)(pBVar12 + 0x10) = *(undefined2 *)(pBVar14 + 0x10);
      pBVar19 = pBVar12 + uVar13 + 4;
      goto LAB_00118bb4;
    }
  }
  pBVar2 = pBVar12 + uVar20;
  pBVar19 = pBVar2;
  if (dest <= pBVar14) {
    if (uVar5 < 0x10) {
      LZ4_memcpy_using_offset(pBVar12,pBVar14,pBVar2,uVar21);
    }
    else {
      do {
        uVar6 = *(undefined8 *)(pBVar12 + -uVar21 + 8);
        *(undefined8 *)pBVar12 = *(undefined8 *)(pBVar12 + -uVar21);
        *(undefined8 *)(pBVar12 + 8) = uVar6;
        uVar6 = *(undefined8 *)(pBVar12 + -uVar21 + 0x10 + 8);
        *(undefined8 *)(pBVar12 + 0x10) = *(undefined8 *)(pBVar12 + -uVar21 + 0x10);
        *(undefined8 *)(pBVar12 + 0x18) = uVar6;
        pBVar12 = pBVar12 + 0x20;
      } while (pBVar12 < pBVar2);
    }
    goto LAB_00118bb4;
  }
  if (pBVar2 <= pBVar1 + -5) {
    uVar13 = (long)dest - (long)pBVar14;
    uVar21 = uVar20 - uVar13;
    if (uVar20 < uVar13 || uVar21 == 0) {
      memmove(pBVar12,(void *)(lVar16 - uVar13),uVar20);
    }
    else {
      memcpy(pBVar12,(void *)(lVar16 - uVar13),uVar13);
      pBVar19 = pBVar12 + uVar13;
      if ((ulong)((long)pBVar19 - (long)dest) < uVar21) {
        pBVar12 = (BYTE *)dest;
        if (uVar13 < uVar20) {
          do {
            *pBVar19 = *pBVar12;
            pBVar19 = pBVar19 + 1;
            pBVar12 = pBVar12 + 1;
          } while (pBVar19 < pBVar2);
        }
      }
      else {
        memcpy(pBVar19,dest,uVar21);
        pBVar19 = pBVar2;
      }
    }
    goto LAB_00118bb4;
  }
LAB_00119058:
  return ~(uint)source + local_50;
LAB_00118f2b:
  pBVar2 = pBVar12 + uVar20;
  pBVar19 = pBVar2;
  if (pBVar14 < dest) {
    if (pBVar1 + -5 < pBVar2) goto LAB_00119058;
    uVar13 = (long)dest - (long)pBVar14;
    uVar21 = uVar20 - uVar13;
    if (uVar20 < uVar13 || uVar21 == 0) {
      memmove(pBVar12,(void *)(lVar16 - uVar13),uVar20);
    }
    else {
      memcpy(pBVar12,(void *)(lVar16 - uVar13),uVar13);
      pBVar19 = pBVar12 + uVar13;
      if ((ulong)((long)pBVar19 - (long)dest) < uVar21) {
        pBVar12 = (BYTE *)dest;
        if (uVar13 < uVar20) {
          do {
            *pBVar19 = *pBVar12;
            pBVar19 = pBVar19 + 1;
            pBVar12 = pBVar12 + 1;
          } while (pBVar19 < pBVar2);
        }
      }
      else {
        memcpy(pBVar19,dest,uVar21);
        pBVar19 = pBVar2;
      }
    }
  }
  else {
    if ((uint)uVar21 < 8) {
      LZ4_decompress_fast_extDict_cold_1();
      pBVar14 = local_38;
    }
    else {
      *(undefined8 *)pBVar12 = *(undefined8 *)pBVar14;
      pBVar14 = pBVar14 + 8;
    }
    pBVar10 = pBVar12 + 8;
    if (pBVar1 + -0xc < pBVar2) {
      if (pBVar1 + -5 < pBVar2) goto LAB_00119058;
      pBVar12 = pBVar1 + -7;
      pBVar11 = pBVar14;
      pBVar15 = pBVar10;
      if (pBVar10 < pBVar12) {
        do {
          *(undefined8 *)pBVar15 = *(undefined8 *)pBVar11;
          pBVar15 = pBVar15 + 8;
          pBVar11 = pBVar11 + 8;
        } while (pBVar15 < pBVar12);
        pBVar14 = pBVar14 + ((long)pBVar12 - (long)pBVar10);
        pBVar10 = pBVar12;
      }
      for (; pBVar10 < pBVar2; pBVar10 = pBVar10 + 1) {
        BVar4 = *pBVar14;
        pBVar14 = pBVar14 + 1;
        *pBVar10 = BVar4;
      }
    }
    else {
      *(undefined8 *)pBVar10 = *(undefined8 *)pBVar14;
      if (0x10 < uVar20) {
        pBVar12 = pBVar12 + 0x10;
        do {
          pBVar14 = pBVar14 + 8;
          *(undefined8 *)pBVar12 = *(undefined8 *)pBVar14;
          pBVar12 = pBVar12 + 8;
        } while (pBVar12 < pBVar2);
      }
    }
  }
LAB_0011901f:
  bVar3 = (byte)*(ushort *)source;
  source = (char *)((long)source + 1);
  while( true ) {
    uVar9 = (uint)bVar3;
    uVar13 = (ulong)(bVar3 >> 4);
    if ((0x8f < uVar9) || (dest + (long)originalSize + -0x1a < pBVar19)) break;
    *(undefined8 *)pBVar19 = *(undefined8 *)source;
    pBVar12 = pBVar19 + uVar13;
    uVar20 = (ulong)(uVar9 & 0xf);
    puVar18 = (ushort *)((long)source + uVar13);
    uVar21 = (ulong)*puVar18;
    pBVar14 = pBVar12 + -uVar21;
    if ((((uVar9 & 0xf) == 0xf) || (*puVar18 < 8)) || (pBVar14 < dest)) goto LAB_00118f05;
    *(undefined8 *)pBVar12 = *(undefined8 *)pBVar14;
    *(undefined8 *)(pBVar12 + 8) = *(undefined8 *)(pBVar14 + 8);
    *(undefined2 *)(pBVar12 + 0x10) = *(undefined2 *)(pBVar14 + 0x10);
    pBVar19 = pBVar12 + uVar20 + 4;
    bVar3 = *(byte *)((long)source + uVar13 + 2);
    source = (char *)((long)source + uVar13 + 3);
  }
  if (bVar3 >> 4 == 0xf) {
    uVar8 = 0;
    do {
      uVar5 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar8 = uVar8 + (byte)uVar5;
    } while ((byte)uVar5 == 0xff);
    uVar13 = (ulong)uVar8 + 0xf;
  }
  pBVar12 = pBVar19 + uVar13;
LAB_00118ecd:
  puVar18 = (ushort *)source;
  if (dest + (long)originalSize + -8 < pBVar12) goto LAB_00119053;
  do {
    *(undefined8 *)pBVar19 = *(undefined8 *)puVar18;
    pBVar19 = pBVar19 + 8;
    puVar18 = puVar18 + 4;
  } while (pBVar19 < pBVar12);
  puVar18 = (ushort *)((long)source + uVar13);
  uVar21 = (ulong)*puVar18;
  pBVar14 = pBVar12 + -uVar21;
  uVar20 = (ulong)(uVar9 & 0xf);
LAB_00118f05:
  source = (char *)(puVar18 + 1);
  if ((int)uVar20 == 0xf) {
    uVar9 = 0;
    do {
      uVar5 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar9 = uVar9 + (byte)uVar5;
    } while ((byte)uVar5 == 0xff);
    uVar20 = (ulong)uVar9 + 0xf;
  }
  uVar20 = uVar20 + 4;
  goto LAB_00118f2b;
LAB_00119053:
  if (pBVar12 == pBVar1) {
    memmove(pBVar19,source,uVar13);
    return ((int)source + (int)uVar13) - local_50;
  }
  goto LAB_00119058;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
static int LZ4_decompress_fast_extDict(const char* source, char* dest, int originalSize,
                                       const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize,
                                  endOnOutputSize, decode_full_block, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}